

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceField.h
# Opt level: O3

void anurbs::BrepFaceField<5l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *pcVar1;
  string name;
  class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_> cStack_b8;
  long *local_b0;
  long local_a0 [2];
  code *local_90;
  undefined8 local_88;
  code *local_80;
  undefined8 local_78;
  arg local_70;
  code *local_60;
  undefined8 local_58;
  arg local_50;
  arg local_40;
  code *local_30;
  undefined8 local_28;
  arg local_20;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_>::
  class_<>(&cStack_b8,(m->super_object).super_handle.m_ptr,(char *)local_b0);
  local_20.name = "face";
  local_20._8_1_ = 2;
  pybind11::class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg>
            (&cStack_b8,"__init__",(type *)&local_80,(is_new_style_constructor *)&local_90,&local_20
            );
  local_80 = BrepFaceField<5L>::face;
  local_78 = 0;
  pcVar1 = (class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *)
           pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
           def_property_readonly<anurbs::Ref<anurbs::BrepFace>(anurbs::BrepFaceField<5l>::*)()const>
                     ((class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>
                       *)&cStack_b8,"face",(offset_in_Model_to_subr *)&local_80);
  local_90 = BrepFaceField<5L>::values;
  local_88 = 0;
  pcVar1 = (class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *)
           pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
           def_property_readonly<std::vector<Eigen::Matrix<double,1,5,1,1,5>,std::allocator<Eigen::Matrix<double,1,5,1,1,5>>>const&(anurbs::BrepFaceField<5l>::*)()const>
                     (pcVar1,"values",(offset_in_Model_to_subr *)&local_90);
  local_30 = BrepFaceField<5L>::set_value;
  local_28 = 0;
  local_40.name = "index";
  local_40._8_1_ = 2;
  local_50.name = "value";
  local_50._8_1_ = 2;
  pcVar1 = (class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *)
           pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
           def<void(anurbs::BrepFaceField<5l>::*)(long,Eigen::Matrix<double,1,5,1,1,5>const&),pybind11::arg,pybind11::arg>
                     (pcVar1,"set_value",(offset_in_Model_to_subr *)&local_30,&local_40,&local_50);
  local_60 = BrepFaceField<5L>::value;
  local_58 = 0;
  local_70.name = "index";
  local_70._8_1_ = 2;
  pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
  def<Eigen::Matrix<double,1,5,1,1,5>(anurbs::BrepFaceField<5l>::*)(long)const,pybind11::arg>
            (pcVar1,"value",(offset_in_Model_to_subr *)&local_60,&local_70);
  pybind11::object::~object((object *)&cStack_b8);
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = BrepFaceField<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // constructors
            .def(py::init<Ref<BrepFace>>(), "face"_a)
            // read-only properties
            .def_property_readonly("face", &Type::face)
            .def_property_readonly("values", &Type::values)
            // methods
            .def("set_value", &Type::set_value, "index"_a, "value"_a)
            .def("value", &Type::value, "index"_a)
        ;
    }